

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codadump-filter.c
# Opt level: O0

void add_filter(codadump_filter **filter,codadump_filter *new_filter)

{
  int iVar1;
  codadump_filter *local_18;
  codadump_filter *new_filter_local;
  codadump_filter **filter_local;
  
  local_18 = new_filter;
  new_filter_local = (codadump_filter *)filter;
  if (filter == (codadump_filter **)0x0) {
    __assert_fail("filter != NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/tools/codadump/codadump-filter.c"
                  ,0x75,"void add_filter(codadump_filter **, codadump_filter *)");
  }
  if (new_filter != (codadump_filter *)0x0) {
    if (*filter == (codadump_filter *)0x0) {
      *filter = new_filter;
    }
    else {
      iVar1 = strcmp((*filter)->fieldname,new_filter->fieldname);
      if (iVar1 == 0) {
        if (*(long *)(new_filter_local->fieldname + 8) != 0) {
          if (local_18->subfilter == (codadump_filter *)0x0) {
            codadump_filter_remove((codadump_filter **)(new_filter_local->fieldname + 8));
          }
          else {
            add_filter((codadump_filter **)(new_filter_local->fieldname + 8),local_18->subfilter);
            local_18->subfilter = (codadump_filter *)0x0;
          }
        }
        codadump_filter_remove(&local_18);
      }
      else if (*(long *)(new_filter_local->fieldname + 0x10) == 0) {
        *(codadump_filter **)(new_filter_local->fieldname + 0x10) = local_18;
      }
      else {
        add_filter((codadump_filter **)(new_filter_local->fieldname + 0x10),local_18);
      }
    }
  }
  return;
}

Assistant:

static void add_filter(codadump_filter **filter, codadump_filter *new_filter)
{
    assert(filter != NULL);

    if (new_filter == NULL)
    {
        return;
    }

    if (*filter == NULL)
    {
        *filter = new_filter;
        return;
    }

    if (strcmp((*filter)->fieldname, new_filter->fieldname) == 0)
    {
        if ((*filter)->subfilter != NULL)
        {
            if (new_filter->subfilter != NULL)
            {
                add_filter(&(*filter)->subfilter, new_filter->subfilter);
                new_filter->subfilter = NULL;
            }
            else
            {
                codadump_filter_remove(&(*filter)->subfilter);
            }
        }
        codadump_filter_remove(&new_filter);
        return;
    }
    else if ((*filter)->next != NULL)
    {
        add_filter(&(*filter)->next, new_filter);
    }
    else
    {
        (*filter)->next = new_filter;
    }
}